

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::SetDirectoriesFromFile(cmake *this,char *arg)

{
  cmState *this_00;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  bool collapse;
  bool collapse_00;
  string *this_01;
  string cwd;
  string full;
  string listFile;
  string listPath;
  string cachePath;
  
  listPath._M_dataplus._M_p = (pointer)&listPath.field_2;
  listPath._M_string_length = 0;
  listPath.field_2._M_local_buf[0] = '\0';
  cachePath._M_dataplus._M_p = (pointer)&cachePath.field_2;
  cachePath._M_string_length = 0;
  cachePath.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&full,arg,(allocator *)&cwd);
  bVar1 = cmsys::SystemTools::FileIsDirectory(&full);
  std::__cxx11::string::~string((string *)&full);
  if (bVar1) {
    std::__cxx11::string::string((string *)&cwd,arg,(allocator *)&listFile);
    cmsys::SystemTools::CollapseFullPath(&full,&cwd);
    std::__cxx11::string::~string((string *)&cwd);
    cmsys::SystemTools::ConvertToUnixSlashes(&full);
    std::__cxx11::string::string((string *)&cwd,(string *)&full);
    std::__cxx11::string::append((char *)&cwd);
    std::__cxx11::string::string((string *)&listFile,(string *)&full);
    std::__cxx11::string::append((char *)&listFile);
    bVar1 = cmsys::SystemTools::FileExists(cwd._M_dataplus._M_p);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&cachePath);
    }
    bVar1 = cmsys::SystemTools::FileExists(listFile._M_dataplus._M_p);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&listPath);
    }
    std::__cxx11::string::~string((string *)&listFile);
    std::__cxx11::string::~string((string *)&cwd);
    std::__cxx11::string::~string((string *)&full);
    bVar1 = false;
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(arg);
    if (bVar1) {
      std::__cxx11::string::string((string *)&cwd,arg,(allocator *)&listFile);
      cmsys::SystemTools::CollapseFullPath(&full,&cwd);
      std::__cxx11::string::~string((string *)&cwd);
      cmsys::SystemTools::GetFilenameName(&cwd,&full);
      cmsys::SystemTools::LowerCase(&listFile,&cwd);
      std::__cxx11::string::operator=((string *)&cwd,(string *)&listFile);
      std::__cxx11::string::~string((string *)&listFile);
      bVar1 = std::operator==(&cwd,"cmakecache.txt");
      if (bVar1) {
        cmsys::SystemTools::GetFilenamePath(&listFile,&full);
        this_01 = &cachePath;
LAB_002778c8:
        std::__cxx11::string::operator=((string *)this_01,(string *)&listFile);
        std::__cxx11::string::~string((string *)&listFile);
      }
      else {
        bVar1 = std::operator==(&cwd,"cmakelists.txt");
        if (bVar1) {
          cmsys::SystemTools::GetFilenamePath(&listFile,&full);
          this_01 = &listPath;
          goto LAB_002778c8;
        }
      }
      std::__cxx11::string::~string((string *)&cwd);
      std::__cxx11::string::~string((string *)&full);
      bVar1 = true;
    }
    else {
      std::__cxx11::string::string((string *)&cwd,arg,(allocator *)&listFile);
      cmsys::SystemTools::CollapseFullPath(&full,&cwd);
      std::__cxx11::string::~string((string *)&cwd);
      cmsys::SystemTools::GetFilenameName(&cwd,&full);
      cmsys::SystemTools::LowerCase(&listFile,&cwd);
      std::__cxx11::string::operator=((string *)&cwd,(string *)&listFile);
      std::__cxx11::string::~string((string *)&listFile);
      bVar1 = std::operator==(&cwd,"cmakecache.txt");
      if (bVar1) {
LAB_00277873:
        cmsys::SystemTools::GetFilenamePath(&listFile,&full);
        std::__cxx11::string::operator=((string *)&listPath,(string *)&listFile);
        std::__cxx11::string::~string((string *)&listFile);
        bVar1 = true;
      }
      else {
        bVar1 = std::operator==(&cwd,"cmakelists.txt");
        if (bVar1) goto LAB_00277873;
        std::__cxx11::string::_M_assign((string *)&listPath);
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&cwd);
      std::__cxx11::string::~string((string *)&full);
    }
  }
  if (cachePath._M_string_length == 0) {
LAB_002779a6:
    if (listPath._M_string_length == 0) {
      std::__cxx11::string::string((string *)&cwd,arg,(allocator *)&listFile);
      cmsys::SystemTools::CollapseFullPath(&full,&cwd);
      std::__cxx11::string::~string((string *)&cwd);
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&cwd,(SystemTools *)0x1,collapse_00)
      ;
      SetHomeDirectory(this,&full);
      SetHomeOutputDirectory(this,&cwd);
      std::__cxx11::string::~string((string *)&cwd);
    }
    else {
      SetHomeDirectory(this,&listPath);
      if (bVar1) {
        SetHomeOutputDirectory(this,&listPath);
        goto LAB_00277a45;
      }
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&full,(SystemTools *)0x1,collapse);
      SetHomeOutputDirectory(this,&full);
    }
  }
  else {
    bVar2 = LoadCache(this,&cachePath);
    if (!bVar2) goto LAB_002779a6;
    this_00 = this->State;
    std::__cxx11::string::string((string *)&full,"CMAKE_HOME_DIRECTORY",(allocator *)&cwd);
    pcVar3 = cmState::GetCacheEntryValue(this_00,&full);
    std::__cxx11::string::~string((string *)&full);
    if (pcVar3 == (char *)0x0) goto LAB_002779a6;
    SetHomeOutputDirectory(this,&cachePath);
    std::__cxx11::string::string((string *)&full,pcVar3,(allocator *)&cwd);
    SetHomeDirectory(this,&full);
  }
  std::__cxx11::string::~string((string *)&full);
LAB_00277a45:
  std::__cxx11::string::~string((string *)&cachePath);
  std::__cxx11::string::~string((string *)&listPath);
  return;
}

Assistant:

void cmake::SetDirectoriesFromFile(const char* arg)
{
  // Check if the argument refers to a CMakeCache.txt or
  // CMakeLists.txt file.
  std::string listPath;
  std::string cachePath;
  bool argIsFile = false;
  if(cmSystemTools::FileIsDirectory(arg))
    {
    std::string path = cmSystemTools::CollapseFullPath(arg);
    cmSystemTools::ConvertToUnixSlashes(path);
    std::string cacheFile = path;
    cacheFile += "/CMakeCache.txt";
    std::string listFile = path;
    listFile += "/CMakeLists.txt";
    if(cmSystemTools::FileExists(cacheFile.c_str()))
      {
      cachePath = path;
      }
    if(cmSystemTools::FileExists(listFile.c_str()))
      {
      listPath = path;
      }
    }
  else if(cmSystemTools::FileExists(arg))
    {
    argIsFile = true;
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if(name == "cmakecache.txt")
      {
      cachePath = cmSystemTools::GetFilenamePath(fullPath);
      }
    else if(name == "cmakelists.txt")
      {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
      }
    }
  else
    {
    // Specified file or directory does not exist.  Try to set things
    // up to produce a meaningful error message.
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if(name == "cmakecache.txt" || name == "cmakelists.txt")
      {
      argIsFile = true;
      listPath = cmSystemTools::GetFilenamePath(fullPath);
      }
    else
      {
      listPath = fullPath;
      }
    }

  // If there is a CMakeCache.txt file, use its settings.
  if(!cachePath.empty())
    {
    if(this->LoadCache(cachePath))
      {
      const char* existingValue =
          this->State->GetCacheEntryValue("CMAKE_HOME_DIRECTORY");
      if (existingValue)
        {
        this->SetHomeOutputDirectory(cachePath);
        this->SetHomeDirectory(existingValue);
        return;
        }
      }
    }

  // If there is a CMakeLists.txt file, use it as the source tree.
  if(!listPath.empty())
    {
    this->SetHomeDirectory(listPath);

    if(argIsFile)
      {
      // Source CMakeLists.txt file given.  It was probably dropped
      // onto the executable in a GUI.  Default to an in-source build.
      this->SetHomeOutputDirectory(listPath);
      }
    else
      {
      // Source directory given on command line.  Use current working
      // directory as build tree.
      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      this->SetHomeOutputDirectory(cwd);
      }
    return;
    }

  // We didn't find a CMakeLists.txt or CMakeCache.txt file from the
  // argument.  Assume it is the path to the source tree, and use the
  // current working directory as the build tree.
  std::string full = cmSystemTools::CollapseFullPath(arg);
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  this->SetHomeDirectory(full);
  this->SetHomeOutputDirectory(cwd);
}